

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int doonnewstack(lua_State *L)

{
  int iVar1;
  lua_State *L_00;
  char *buff;
  size_t l;
  size_t local_20;
  
  L_00 = lua_newthread(L);
  buff = luaL_checklstring(L,1,&local_20);
  iVar1 = luaL_loadbufferx(L_00,buff,local_20,buff,(char *)0x0);
  if (iVar1 == 0) {
    iVar1 = lua_pcallk(L_00,0,0,0,0,(lua_KFunction)0x0);
  }
  lua_pushinteger(L,(long)iVar1);
  return 1;
}

Assistant:

static int doonnewstack (lua_State *L) {
  lua_State *L1 = lua_newthread(L);
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  int status = luaL_loadbuffer(L1, s, l, s);
  if (status == LUA_OK)
    status = lua_pcall(L1, 0, 0, 0);
  lua_pushinteger(L, status);
  return 1;
}